

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

LY_ERR lyd_validate_ext(lyd_node **tree,lysc_ext_instance *ext,uint32_t val_opts,
                       ly_bool validate_subtree,ly_set *node_when_p,ly_set *node_types_p,
                       ly_set *meta_types_p,ly_set *ext_node_p,ly_set *ext_val_p,lyd_node **diff)

{
  ly_ht *getnext_ht_00;
  LY_ERR LVar1;
  LY_ERR LVar2;
  lyd_node *root;
  ly_ht *getnext_ht;
  lyd_node **local_b0;
  ly_set *local_a8;
  ly_set *local_a0;
  ly_set *local_98;
  lysc_ext_instance *local_90;
  ly_set ext_val;
  ly_set ext_node;
  ly_set node_when;
  ly_set meta_types;
  ly_set node_types;
  
  node_types.size = 0;
  node_types.count = 0;
  node_types.field_2.dnodes = (lyd_node **)0x0;
  meta_types.size = 0;
  meta_types.count = 0;
  meta_types.field_2.dnodes = (lyd_node **)0x0;
  node_when.size = 0;
  node_when.count = 0;
  node_when.field_2.dnodes = (lyd_node **)0x0;
  ext_node.size = 0;
  ext_node.count = 0;
  ext_node.field_2.dnodes = (lyd_node **)0x0;
  ext_val.size = 0;
  ext_val.count = 0;
  ext_val.field_2.dnodes = (lyd_node **)0x0;
  getnext_ht = (ly_ht *)0x0;
  if (tree == (lyd_node **)0x0) {
    __assert_fail("tree",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x81f,
                  "LY_ERR lyd_validate_ext(struct lyd_node **, const struct lysc_ext_instance *, uint32_t, ly_bool, struct ly_set *, struct ly_set *, struct ly_set *, struct ly_set *, struct ly_set *, struct lyd_node **)"
                 );
  }
  local_98 = meta_types_p;
  local_a0 = ext_node_p;
  local_a8 = ext_val_p;
  if (((ext_node_p == (ly_set *)0x0 ||
       (meta_types_p == (ly_set *)0x0 ||
       (node_types_p == (ly_set *)0x0 || node_when_p == (ly_set *)0x0))) ||
       ext_val_p == (ly_set *)0x0) &&
     ((((node_when_p != (ly_set *)0x0 || (node_types_p != (ly_set *)0x0)) ||
       (meta_types_p != (ly_set *)0x0)) ||
      ((ext_node_p != (ly_set *)0x0 || (ext_val_p != (ly_set *)0x0)))))) {
    __assert_fail("(node_when_p && node_types_p && meta_types_p && ext_node_p && ext_val_p) || (!node_when_p && !node_types_p && !meta_types_p && !ext_node_p && !ext_val_p)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x821,
                  "LY_ERR lyd_validate_ext(struct lyd_node **, const struct lysc_ext_instance *, uint32_t, ly_bool, struct ly_set *, struct ly_set *, struct ly_set *, struct ly_set *, struct ly_set *, struct lyd_node **)"
                 );
  }
  if (node_when_p == (ly_set *)0x0) {
    node_when_p = &node_when;
    local_a8 = &ext_val;
    local_a0 = &ext_node;
    local_98 = &meta_types;
    node_types_p = &node_types;
  }
  local_b0 = tree;
  LVar1 = lyd_val_getnext_ht_new(&getnext_ht);
  getnext_ht_00 = getnext_ht;
  if (LVar1 != LY_SUCCESS) goto LAB_001baca2;
  LVar2 = LY_SUCCESS;
  local_90 = ext;
  if ((validate_subtree != '\0') && (root = *local_b0, root != (lyd_node *)0x0)) {
    LVar2 = LY_SUCCESS;
    do {
      LVar1 = lyd_validate_subtree
                        (root,node_when_p,node_types_p,local_98,local_a0,local_a8,val_opts,0,
                         getnext_ht_00,diff);
      if (LVar1 != LY_SUCCESS) {
        if (LVar1 != LY_EVALID) goto LAB_001baca2;
        LVar2 = LY_EVALID;
        LVar1 = LY_EVALID;
        if ((val_opts & 4) == 0) goto LAB_001baca2;
      }
      root = root->next;
    } while (root != (lyd_node *)0x0);
  }
  LVar1 = lyd_validate_unres(local_b0,(lys_module *)0x0,LYD_TYPE_DATA_YANG,node_when_p,0,
                             node_types_p,local_98,local_a0,local_a8,val_opts,diff);
  if (LVar1 != LY_SUCCESS) {
    if (LVar1 != LY_EVALID) goto LAB_001baca2;
    LVar2 = LY_EVALID;
    LVar1 = LY_EVALID;
    if ((val_opts & 4) == 0) goto LAB_001baca2;
  }
  LVar1 = LVar2;
  if (((val_opts & 0x20) == 0) &&
     (LVar2 = lyd_validate_final_r
                        (*local_b0,(lyd_node *)0x0,(lysc_node *)0x0,(lys_module *)0x0,local_90,
                         val_opts,0,0,getnext_ht), LVar2 != LY_SUCCESS)) {
    LVar1 = LVar2;
  }
LAB_001baca2:
  ly_set_erase(&node_when,(_func_void_void_ptr *)0x0);
  ly_set_erase(&node_types,(_func_void_void_ptr *)0x0);
  ly_set_erase(&meta_types,(_func_void_void_ptr *)0x0);
  ly_set_erase(&ext_node,free);
  ly_set_erase(&ext_val,free);
  lyht_free(getnext_ht,lyd_val_getnext_ht_free_cb);
  return LVar1;
}

Assistant:

LY_ERR
lyd_validate_ext(struct lyd_node **tree, const struct lysc_ext_instance *ext, uint32_t val_opts,
        ly_bool validate_subtree, struct ly_set *node_when_p, struct ly_set *node_types_p, struct ly_set *meta_types_p,
        struct ly_set *ext_node_p, struct ly_set *ext_val_p, struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_node *iter;
    struct ly_set node_types = {0}, meta_types = {0}, node_when = {0}, ext_node = {0}, ext_val = {0};
    struct ly_ht *getnext_ht = NULL;

    assert(tree);
    assert((node_when_p && node_types_p && meta_types_p && ext_node_p && ext_val_p) ||
            (!node_when_p && !node_types_p && !meta_types_p && !ext_node_p && !ext_val_p));

    if (!node_when_p) {
        node_when_p = &node_when;
        node_types_p = &node_types;
        meta_types_p = &meta_types;
        ext_node_p = &ext_node;
        ext_val_p = &ext_val;
    }

    /* create the getnext hash table for these data */
    r = lyd_val_getnext_ht_new(&getnext_ht);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

    if (validate_subtree) {
        /* process nested nodes */
        LY_LIST_FOR(*tree, iter) {
            r = lyd_validate_subtree(iter, node_when_p, node_types_p, meta_types_p, ext_node_p, ext_val_p,
                    val_opts, 0, getnext_ht, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);
        }
    }

    /* finish incompletely validated terminal values/attributes and when conditions */
    r = lyd_validate_unres(tree, NULL, LYD_TYPE_DATA_YANG, node_when_p, 0, node_types_p, meta_types_p,
            ext_node_p, ext_val_p, val_opts, diff);
    LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

    if (!(val_opts & LYD_VALIDATE_NOT_FINAL)) {
        /* perform final validation that assumes the data tree is final */
        r = lyd_validate_final_r(*tree, NULL, NULL, NULL, ext, val_opts, 0, 0, getnext_ht);
        LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);
    }

cleanup:
    ly_set_erase(&node_when, NULL);
    ly_set_erase(&node_types, NULL);
    ly_set_erase(&meta_types, NULL);
    ly_set_erase(&ext_node, free);
    ly_set_erase(&ext_val, free);
    lyd_val_getnext_ht_free(getnext_ht);
    return rc;
}